

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                  *this)

{
  SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_004810a8;
  VariableByte::~VariableByte((VariableByte *)0x15554a);
  SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::~SIMDNewPFor(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}